

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetNextAgentIndex::operator()
          (SetNextAgentIndex *this,iterator_t *str,iterator_t *end)

{
  ostream *poVar1;
  long *in_RDI;
  
  if ((ulong)*(uint *)(*in_RDI + 0x50) < *(ulong *)(*in_RDI + 0x48)) {
    *(int *)(*in_RDI + 0x50) = *(int *)(*in_RDI + 0x50) + 1;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "SetNextAgentIndex - ERROR: current agent index (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(*in_RDI + 0x50));
    poVar1 = std::operator<<(poVar1,") out of bounds (number of agents=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(*in_RDI + 0x48));
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_curAI < _m_po->_m_nrA)
                    _m_po->_m_curAI++;
                else
                    std::cout << "SetNextAgentIndex - ERROR: current agent index ("<<
                               _m_po->_m_curAI<<") out of bounds (number of agents="<<
                        _m_po->_m_nrA<<")"<<std::endl;            
            }